

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomDate::read(DomDate *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  undefined4 in_register_00000034;
  QXmlStreamReader *this_00;
  long in_FS_OFFSET;
  QStringView other;
  QStringView other_00;
  QStringView other_01;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_78;
  QArrayDataPointer<char16_t> local_60;
  QStringView local_48;
  long local_38;
  
  this_00 = (QXmlStreamReader *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError(this_00);
      if (bVar1) goto LAB_0015ca4f;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      local_48.m_size = -0x5555555555555556;
      local_48.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
      local_48 = (QStringView)QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s((QString *)&local_60,L"year",4);
      other.m_data = local_60.ptr;
      other.m_size = local_60.size;
      iVar2 = QStringView::compare(&local_48,other,CaseInsensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
      if (iVar2 == 0) {
        QXmlStreamReader::readElementText(&local_60,this_00,0);
        iVar2 = QString::toInt((QString *)&local_60,(bool *)0x0,10);
        *(byte *)&this->m_children = (byte)this->m_children | 1;
        this->m_year = iVar2;
      }
      else {
        Qt::Literals::StringLiterals::operator____s((QString *)&local_60,L"month",5);
        other_00.m_data = local_60.ptr;
        other_00.m_size = local_60.size;
        iVar2 = QStringView::compare(&local_48,other_00,CaseInsensitive);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
        if (iVar2 == 0) {
          QXmlStreamReader::readElementText(&local_60,this_00,0);
          iVar2 = QString::toInt((QString *)&local_60,(bool *)0x0,10);
          *(byte *)&this->m_children = (byte)this->m_children | 2;
          this->m_month = iVar2;
        }
        else {
          Qt::Literals::StringLiterals::operator____s((QString *)&local_60,L"day",3);
          other_01.m_data = local_60.ptr;
          other_01.m_size = local_60.size;
          iVar2 = QStringView::compare(&local_48,other_01,CaseInsensitive);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
          if (iVar2 == 0) {
            QXmlStreamReader::readElementText(&local_60,this_00,0);
            iVar2 = QString::toInt((QString *)&local_60,(bool *)0x0,10);
            *(byte *)&this->m_children = (byte)this->m_children | 4;
            this->m_day = iVar2;
          }
          else {
            local_78.a.m_size = 0x13;
            local_78.a.m_data = "Unexpected element ";
            local_78.b = &local_48;
            QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                      ((QString *)&local_60,&local_78);
            QXmlStreamReader::raiseError((QString *)this_00);
          }
        }
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    }
  } while (iVar2 != 5);
LAB_0015ca4f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomDate::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"year"_s, Qt::CaseInsensitive)) {
                setElementYear(reader.readElementText().toInt());
                continue;
            }
            if (!tag.compare(u"month"_s, Qt::CaseInsensitive)) {
                setElementMonth(reader.readElementText().toInt());
                continue;
            }
            if (!tag.compare(u"day"_s, Qt::CaseInsensitive)) {
                setElementDay(reader.readElementText().toInt());
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}